

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.h
# Opt level: O2

int LZ4HC_compress_optimal
              (LZ4HC_CCtx_internal *ctx,char *source,char *dest,int inputSize,int maxOutputSize,
              limitedOutput_directive limit,size_t sufficient_len,int fullUpdate)

{
  int *pIn;
  ulong uVar1;
  byte *pInLimit;
  ushort uVar2;
  uint8_t *puVar3;
  uint8_t *puVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  LZ4HC_optimal_t *pLVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  LZ4HC_match_t *pLVar19;
  ulong uVar20;
  LZ4HC_optimal_t *pLVar21;
  size_t price;
  ulong uVar22;
  uint uVar23;
  int iVar24;
  uint uVar25;
  ulong uVar26;
  int *piVar27;
  uint uVar28;
  uint32_t uVar29;
  ulong uVar30;
  long lVar31;
  char *pcVar32;
  char cVar33;
  ulong uVar34;
  char *pcVar35;
  uint16_t *puVar36;
  int *pIn_00;
  byte *pbVar37;
  undefined2 *puVar38;
  uint32_t uVar39;
  BYTE *pBVar40;
  bool bVar41;
  BYTE *pBStack_18160;
  uint16_t *puStack_18150;
  ulong uStack_18140;
  uint16_t *puStack_18130;
  ulong uStack_18128;
  ulong uStack_18118;
  undefined2 *puStack_180e0;
  int *piStack_180c8;
  char *pcStack_180a0;
  int iStack_18078;
  ulong uStack_18058;
  ulong uStack_18050;
  LZ4HC_optimal_t opt [4097];
  LZ4HC_match_t matches [4097];
  
  lVar14 = (long)inputSize;
  uVar30 = 0xfff;
  if (sufficient_len < 0xfff) {
    uVar30 = sufficient_len;
  }
  ctx->end = ctx->end + lVar14;
  pInLimit = (byte *)(source + lVar14 + -5);
  pIn_00 = (int *)(source + 1);
  piStack_180c8 = (int *)source;
  pcStack_180a0 = dest;
LAB_00133b06:
  do {
    if (source + lVar14 + -0xc <= pIn_00) {
      pcVar32 = source + (lVar14 - (long)piStack_180c8);
      iVar24 = (int)pcVar32;
      if ((limit == noLimit) ||
         (iStack_18078 = 0,
         (long)(pcStack_180a0 + (ulong)(iVar24 + 0xf0) / 0xff + ((long)iVar24 - (long)dest) + 1) <=
         (long)(ulong)(uint)maxOutputSize)) {
        if (iVar24 < 0xf) {
          *pcStack_180a0 = (char)pcVar32 << 4;
          pcStack_180a0 = pcStack_180a0 + 1;
        }
        else {
          *pcStack_180a0 = -0x10;
          pcStack_180a0 = pcStack_180a0 + 2;
          for (iVar10 = iVar24 + -0xf; 0xfe < iVar10; iVar10 = iVar10 + -0xff) {
            pcStack_180a0[-1] = -1;
            pcStack_180a0 = pcStack_180a0 + 1;
          }
          pcStack_180a0[-1] = (char)iVar10;
        }
        memcpy(pcStack_180a0,piStack_180c8,(size_t)pcVar32);
        iStack_18078 = (int)dest;
        iStack_18078 = ((int)pcStack_180a0 + iVar24) - iStack_18078;
      }
      return iStack_18078;
    }
    puVar3 = ctx->base;
    uVar20 = (ulong)ctx->nextToUpdate;
    if (puVar3 + uVar20 <= pIn_00) {
      if (fullUpdate != 0) {
        for (; uVar20 < ((long)pIn_00 - (long)puVar3 & 0xffffffffU); uVar20 = uVar20 + 1) {
          uVar28 = (uint)uVar20;
          uVar7 = uVar28 - 0xfffe;
          if (uVar20 < ctx->lowLimit + 0xffff) {
            uVar7 = ctx->lowLimit;
          }
          if (puVar3 + uVar20 + 4 <= pInLimit) {
            piVar27 = (int *)(puVar3 + uVar20);
            uVar25 = ctx->dictLimit;
            puVar4 = ctx->dictBase;
            uVar29 = ctx->searchNum;
            uVar5 = (uint)(*piVar27 * -0x61c8864f) >> 0x11;
            uVar23 = ctx->hashTable[uVar5];
            ctx->hashTable[uVar5] = uVar28;
            uVar22 = (ulong)((uVar28 & 0xffff) << 2);
            puVar36 = (uint16_t *)((long)ctx->chainTable + uVar22 + 2);
            puVar38 = (undefined2 *)((long)ctx->chainTable + uVar22);
            uVar28 = uVar28 - uVar23;
            uStack_18128 = 8;
            uVar5 = uVar28;
            for (; uVar22 = (ulong)uVar23, uVar22 < uVar20; uVar23 = uVar23 - uVar6) {
              bVar41 = uVar29 == 0;
              uVar29 = uVar29 - 1;
              if ((uVar23 < uVar7) || (bVar41)) break;
              if (uVar23 < uVar25) {
                pbVar37 = (byte *)((ulong)(uVar25 - uVar23) + (long)piVar27);
                pBVar40 = puVar4 + uVar22;
                if (pInLimit < pbVar37) {
                  pbVar37 = pInLimit;
                }
                uVar6 = LZ4_count((BYTE *)piVar27,pBVar40,pbVar37);
                uVar22 = (ulong)uVar6;
                if ((pbVar37 < pInLimit) && ((byte *)((long)piVar27 + uVar22) == pbVar37)) {
                  uVar6 = LZ4_count((byte *)((long)piVar27 + uVar22),puVar3 + uVar25,pInLimit);
                  uVar22 = uVar22 + uVar6;
                }
              }
              else {
                pBVar40 = puVar3 + uVar22;
                uVar6 = LZ4_count((BYTE *)piVar27,pBVar40,pInLimit);
                uVar22 = (ulong)uVar6;
              }
              if (((uStack_18128 < uVar22) && (uStack_18128 = uVar22, 0x1000 < uVar22)) ||
                 (pInLimit <= (byte *)((long)piVar27 + uVar22))) break;
              uVar34 = (ulong)((uVar23 & 0xffff) * 2);
              if (*(byte *)((long)piVar27 + uVar22) < pBVar40[uVar22]) {
                *puVar36 = (ushort)uVar28;
                puVar36 = ctx->chainTable + uVar34;
                uVar28 = (uint)*puVar36;
                if (*puVar36 == 0xffff) break;
                uVar5 = uVar5 + uVar28;
                uVar6 = uVar28;
              }
              else {
                *puVar38 = (short)uVar5;
                puVar38 = (undefined2 *)((long)ctx->chainTable + (uVar34 * 2 | 2));
                uVar5 = (uint)ctx->chainTable[uVar34 + 1];
                if (ctx->chainTable[uVar34 + 1] == 0xffff) break;
                uVar28 = uVar28 + uVar5;
                uVar6 = uVar5;
              }
            }
            *puVar36 = 0xffff;
            *puVar38 = 0xffff;
          }
        }
      }
      uVar28 = ctx->dictLimit;
      uVar7 = ctx->lowLimit;
      uVar23 = (uint)((long)pIn_00 - (long)puVar3);
      uStack_18058 = (ulong)(uVar7 + 0xffff);
      uStack_18050 = (ulong)uVar7;
      uVar25 = uVar23 - 0xfffe;
      if (uVar23 < uVar7 + 0xffff) {
        uVar25 = uVar7;
      }
      puVar4 = ctx->dictBase;
      iVar24 = 0;
      if (pIn_00 + 1 <= pInLimit) {
        uVar29 = ctx->searchNum;
        uVar7 = (uint)(*pIn_00 * -0x61c8864f) >> 0x11;
        uVar39 = ctx->hashTable[uVar7];
        ctx->hashTable[uVar7] = uVar23;
        uVar20 = (ulong)((uVar23 & 0xffff) << 2);
        puStack_18130 = (uint16_t *)((long)ctx->chainTable + uVar20 + 2);
        pBStack_18160 = (BYTE *)((long)ctx->chainTable + uVar20);
        uVar5 = uVar23 - uVar39;
        iVar24 = 0;
        uStack_18128 = 3;
        uVar7 = uVar5;
        for (; uVar39 < uVar23; uVar39 = uVar39 - uVar6) {
          bVar41 = uVar29 == 0;
          uVar29 = uVar29 - 1;
          if ((uVar39 < uVar25) || (bVar41)) break;
          if (uVar39 < uVar28) {
            pbVar37 = (byte *)((ulong)(uVar28 - uVar39) + (long)pIn_00);
            pBVar40 = puVar4 + uVar39;
            if (pInLimit < pbVar37) {
              pbVar37 = pInLimit;
            }
            uVar6 = LZ4_count((BYTE *)pIn_00,pBVar40,pbVar37);
            uVar20 = (ulong)uVar6;
            if ((pbVar37 < pInLimit) && ((byte *)(uVar20 + (long)pIn_00) == pbVar37)) {
              uVar6 = LZ4_count(pbVar37,puVar3 + uVar28,pInLimit);
              uVar20 = uVar20 + uVar6;
            }
          }
          else {
            pBVar40 = puVar3 + uVar39;
            uVar6 = LZ4_count((BYTE *)pIn_00,pBVar40,pInLimit);
            uVar20 = (ulong)uVar6;
          }
          if (uStack_18128 < uVar20) {
            matches[iVar24].off = (int)pIn_00 - (uVar39 + (int)puVar3);
            matches[iVar24].len = (int)uVar20;
            iVar24 = iVar24 + 1;
            uStack_18128 = uVar20;
            if (0x1000 < uVar20) break;
          }
          if (pInLimit <= (byte *)((long)pIn_00 + uVar20)) break;
          uVar22 = (ulong)((uVar39 & 0xffff) * 2);
          if (*(byte *)((long)pIn_00 + uVar20) < pBVar40[uVar20]) {
            *puStack_18130 = (ushort)uVar7;
            puStack_18130 = ctx->chainTable + uVar22;
            uVar2 = *puStack_18130;
            uVar7 = (uint)uVar2;
            if (uVar2 == 0xffff) break;
            uVar5 = uVar5 + uVar2;
            uVar6 = (uint)uVar2;
          }
          else {
            *(short *)pBStack_18160 = (short)uVar5;
            pBStack_18160 = (BYTE *)((long)ctx->chainTable + (uVar22 * 2 | 2));
            uVar5 = (uint)ctx->chainTable[uVar22 + 1];
            if (ctx->chainTable[uVar22 + 1] == 0xffff) break;
            uVar7 = uVar7 + uVar5;
            uVar6 = uVar5;
          }
        }
        *puStack_18130 = 0xffff;
        pBStack_18160[0] = 0xff;
        pBStack_18160[1] = 0xff;
      }
      uStack_18140 = (ulong)(uVar23 + 1);
      ctx->nextToUpdate = uVar23 + 1;
      if (iVar24 != 0) {
        lVar15 = (long)iVar24;
        uVar20 = (ulong)matches[lVar15 + -1].len;
        if (uVar30 < uVar20) {
          pLVar19 = matches + lVar15 + -1;
          uVar34 = 0;
          uVar22 = 1;
LAB_00134a8b:
          iVar24 = pLVar19->off;
          do {
            uVar28 = opt[uVar34].mlen;
            iVar10 = opt[uVar34].off;
            opt[uVar34].mlen = (int)uVar20;
            opt[uVar34].off = iVar24;
            uVar20 = (ulong)uVar28;
            bVar41 = (ulong)(long)(int)uVar28 <= uVar34;
            uVar34 = uVar34 - (long)(int)uVar28;
            iVar24 = iVar10;
          } while (bVar41);
          lVar15 = 0;
          do {
            cVar33 = (char)pIn_00 * '\x10' + (char)piStack_180c8 * -0x10;
            uVar20 = (long)pIn_00 - (long)piStack_180c8;
            piVar27 = &opt[lVar15].mlen;
            lVar31 = 0;
            while( true ) {
              if (uVar22 <= (ulong)(lVar15 + lVar31)) {
                pIn_00 = (int *)((long)pIn_00 + lVar31);
                goto LAB_00133b06;
              }
              iVar24 = *piVar27;
              lVar13 = (long)iVar24;
              if (lVar13 != 1) break;
              lVar31 = lVar31 + 1;
              cVar33 = cVar33 + '\x10';
              uVar20 = uVar20 + 1;
              piVar27 = piVar27 + 4;
            }
            iVar10 = piVar27[-1];
            if ((limit != noLimit) &&
               (dest + maxOutputSize <
                pcStack_180a0 + (long)pIn_00 + lVar31 + ((uVar20 >> 8) - (long)piStack_180c8) + 9))
            {
              return 0;
            }
            if ((ulong)((long)pIn_00 + (lVar31 - (long)piStack_180c8)) < 0xf) {
              pcVar32 = pcStack_180a0 + 1;
              *pcStack_180a0 = cVar33;
            }
            else {
              *pcStack_180a0 = -0x10;
              pcVar32 = pcStack_180a0 + 2;
              for (uVar20 = (long)pIn_00 + (lVar31 - (long)piStack_180c8) + -0xf; 0xfe < uVar20;
                  uVar20 = uVar20 - 0xff) {
                pcVar32[-1] = -1;
                pcVar32 = pcVar32 + 1;
              }
              pcVar32[-1] = (char)uVar20;
            }
            lVar15 = lVar15 + lVar13 + lVar31;
            pcVar35 = pcVar32;
            piVar27 = piStack_180c8;
            do {
              *(undefined8 *)pcVar35 = *(undefined8 *)piVar27;
              pcVar35 = pcVar35 + 8;
              piVar27 = piVar27 + 2;
            } while (pcVar35 < pcVar32 + (long)pIn_00 + (lVar31 - (long)piStack_180c8));
            uVar28 = iVar24 - 4;
            *(short *)(pcVar32 + (long)pIn_00 + (lVar31 - (long)piStack_180c8)) = (short)iVar10;
            if ((limit != noLimit) &&
               (dest + maxOutputSize <
                pcVar32 + (long)pIn_00 +
                          ((ulong)(long)(int)uVar28 >> 8) + (lVar31 - (long)piStack_180c8) + 8)) {
              return 0;
            }
            pcVar32 = pcVar32 + (long)pIn_00 + (lVar31 - (long)piStack_180c8) + 2;
            if (uVar28 < 0xf) {
              *pcStack_180a0 = *pcStack_180a0 + (char)uVar28;
            }
            else {
              *pcStack_180a0 = *pcStack_180a0 + '\x0f';
              for (uVar20 = (long)(int)uVar28 - 0xf; 0x1fd < uVar20; uVar20 = uVar20 - 0x1fe) {
                pcVar32[0] = -1;
                pcVar32[1] = -1;
                pcVar32 = pcVar32 + 2;
              }
              if (0xfe < uVar20) {
                uVar20 = uVar20 - 0xff;
                *pcVar32 = -1;
                pcVar32 = pcVar32 + 1;
              }
              *pcVar32 = (char)uVar20;
              pcVar32 = pcVar32 + 1;
            }
            piStack_180c8 = (int *)((long)pIn_00 + lVar31 + lVar13);
            pIn_00 = piStack_180c8;
            pcStack_180a0 = pcVar32;
          } while( true );
        }
        uVar26 = (long)pIn_00 - (long)piStack_180c8;
        uVar11 = uVar26 + 1 + (uVar26 - 0xf) / 0xff;
        uVar20 = uVar26;
        if (0xe < uVar26) {
          uVar20 = uVar11;
        }
        iVar24 = (int)uVar20 + 3;
        uVar22 = 0;
        for (lVar31 = 0; lVar31 != lVar15; lVar31 = lVar31 + 1) {
          uVar34 = 4;
          if (lVar31 != 0) {
            uVar34 = (long)matches[lVar31 + -1].len + 1;
          }
          iVar10 = matches[lVar31].len;
          for (; uVar34 <= (ulong)(long)iVar10; uVar34 = uVar34 + 1) {
            iVar8 = iVar24;
            if (0x12 < uVar34) {
              iVar8 = (int)((uVar34 - 0x13) / 0xff) + iVar24 + 1;
            }
            pLVar21 = opt + uVar22 + 1;
            for (; uVar22 < uVar34; uVar22 = uVar22 + 1) {
              pLVar21->price = 0x40000000;
              pLVar21 = pLVar21 + 1;
            }
            opt[uVar34].mlen = (int)uVar34;
            opt[uVar34].off = matches[lVar31].off;
            opt[uVar34].litlen = 0;
            opt[uVar34].price = iVar8 - (int)uVar20;
          }
        }
        if (3 < uVar22) {
          if (uVar26 < 0xf) {
            uVar11 = uVar26;
          }
          for (uVar34 = 1; uVar34 <= uVar22; uVar34 = uVar34 + 1) {
            if (opt[uVar34 - 1].mlen == 1) {
              uVar16 = (long)opt[uVar34 - 1].litlen + 1;
              if (uVar34 < uVar16 || uVar34 - uVar16 == 0) {
                uVar20 = uVar16 + uVar26;
                if (0xe < uVar20) {
                  uVar20 = uVar20 + (uVar20 - 0xf) / 0xff + 1;
                }
                uVar20 = uVar20 - uVar11;
              }
              else {
                uVar20 = uVar16;
                if (0xe < (uint)uVar16) {
                  uVar20 = uVar16 + ((long)opt[uVar34 - 1].litlen - 0xeU) / 0xff + 1;
                }
                uVar20 = uVar20 + (long)opt[uVar34 - uVar16].price;
              }
            }
            else {
              uVar20 = (long)(int)(&uStack_18058)[uVar34 * 2] + 1;
              uVar16 = 1;
            }
            pLVar21 = opt + uVar34;
            if (uVar20 < (ulong)(long)pLVar21->price) {
              pLVar12 = opt + uVar22 + 1;
              for (; uVar22 < uVar34; uVar22 = uVar22 + 1) {
                pLVar12->price = 0x40000000;
                pLVar12 = pLVar12 + 1;
              }
              opt[uVar34].off = 0;
              opt[uVar34].mlen = 1;
              opt[uVar34].litlen = (int)uVar16;
              pLVar21->price = (int)uVar20;
            }
            if ((uVar34 == uVar22) ||
               (piVar27 = (int *)((long)pIn_00 + uVar34), source + lVar14 + -0xc <= piVar27)) break;
            if (piVar27 < puVar3 + uStack_18140) {
LAB_001348ce:
              lVar15 = 0;
            }
            else {
              if (fullUpdate != 0) {
                for (; uStack_18140 < ((long)piVar27 - (long)puVar3 & 0xffffffffU);
                    uStack_18140 = uStack_18140 + 1) {
                  uVar7 = (uint)uStack_18140;
                  uVar25 = uVar7 - 0xfffe;
                  if (uStack_18140 < uStack_18058) {
                    uVar25 = (uint)uStack_18050;
                  }
                  if (puVar3 + uStack_18140 + 4 <= pInLimit) {
                    pIn = (int *)(puVar3 + uStack_18140);
                    uVar29 = ctx->searchNum;
                    uVar23 = (uint)(*pIn * -0x61c8864f) >> 0x11;
                    uVar39 = ctx->hashTable[uVar23];
                    ctx->hashTable[uVar23] = uVar7;
                    uVar20 = (ulong)((uVar7 & 0xffff) << 2);
                    puStack_18150 = (uint16_t *)((long)ctx->chainTable + uVar20 + 2);
                    puStack_180e0 = (undefined2 *)((long)ctx->chainTable + uVar20);
                    uVar7 = uVar7 - uVar39;
                    uStack_18118 = 8;
                    uVar23 = uVar7;
                    for (; uVar20 = (ulong)uVar39, uVar20 < uStack_18140; uVar39 = uVar39 - uVar5) {
                      bVar41 = uVar29 == 0;
                      uVar29 = uVar29 - 1;
                      if ((uVar39 < uVar25) || (bVar41)) break;
                      if (uVar39 < uVar28) {
                        pbVar37 = (byte *)((ulong)(uVar28 - uVar39) + (long)pIn);
                        pBStack_18160 = puVar4 + uVar20;
                        if (pInLimit < pbVar37) {
                          pbVar37 = pInLimit;
                        }
                        uVar5 = LZ4_count((BYTE *)pIn,pBStack_18160,pbVar37);
                        uVar20 = (ulong)uVar5;
                        if ((pbVar37 < pInLimit) && ((byte *)((long)pIn + uVar20) == pbVar37)) {
                          uVar5 = LZ4_count((byte *)((long)pIn + uVar20),puVar3 + uVar28,pInLimit);
                          uVar20 = uVar20 + uVar5;
                        }
                      }
                      else {
                        pBStack_18160 = puVar3 + uVar20;
                        uVar5 = LZ4_count((BYTE *)pIn,pBStack_18160,pInLimit);
                        uVar20 = (ulong)uVar5;
                      }
                      if (((uStack_18118 < uVar20) && (uStack_18118 = uVar20, 0x1000 < uVar20)) ||
                         (pInLimit <= (byte *)((long)pIn + uVar20))) break;
                      uVar16 = (ulong)((uVar39 & 0xffff) * 2);
                      if (*(byte *)((long)pIn + uVar20) < pBStack_18160[uVar20]) {
                        *puStack_18150 = (ushort)uVar7;
                        puStack_18150 = ctx->chainTable + uVar16;
                        uVar7 = (uint)*puStack_18150;
                        if (*puStack_18150 == 0xffff) break;
                        uVar23 = uVar23 + uVar7;
                        uVar5 = uVar7;
                      }
                      else {
                        *puStack_180e0 = (short)uVar23;
                        puStack_180e0 = (undefined2 *)((long)ctx->chainTable + (uVar16 * 2 | 2));
                        uVar23 = (uint)ctx->chainTable[uVar16 + 1];
                        if (ctx->chainTable[uVar16 + 1] == 0xffff) break;
                        uVar7 = uVar7 + uVar23;
                        uVar5 = uVar23;
                      }
                    }
                    *puStack_18150 = 0xffff;
                    *puStack_180e0 = 0xffff;
                  }
                }
              }
              uVar7 = (uint)((long)piVar27 - (long)puVar3);
              uVar25 = uVar7 - 0xfffe;
              if (uVar7 < (uint)uStack_18058) {
                uVar25 = (uint)uStack_18050;
              }
              if (pInLimit < piVar27 + 1) {
                uStack_18140 = (ulong)(uVar7 + 1);
                ctx->nextToUpdate = uVar7 + 1;
                goto LAB_001348ce;
              }
              uVar29 = ctx->searchNum;
              uVar5 = (uint)(*piVar27 * -0x61c8864f) >> 0x11;
              uVar23 = ctx->hashTable[uVar5];
              ctx->hashTable[uVar5] = uVar7;
              uVar20 = (ulong)((uVar7 & 0xffff) << 2);
              puStack_18150 = (uint16_t *)((long)ctx->chainTable + uVar20 + 2);
              puStack_180e0 = (undefined2 *)((long)ctx->chainTable + uVar20);
              uVar6 = uVar7 - uVar23;
              iVar24 = 0;
              uStack_18118 = 3;
              uVar5 = uVar6;
              for (; uVar23 < uVar7; uVar23 = uVar23 - uVar9) {
                bVar41 = uVar29 == 0;
                uVar29 = uVar29 - 1;
                if ((uVar23 < uVar25) || (bVar41)) break;
                if (uVar23 < uVar28) {
                  pbVar37 = (byte *)((ulong)(uVar28 - uVar23) + (long)piVar27);
                  pBVar40 = puVar4 + uVar23;
                  if (pInLimit < pbVar37) {
                    pbVar37 = pInLimit;
                  }
                  uVar9 = LZ4_count((BYTE *)piVar27,pBVar40,pbVar37);
                  uVar20 = (ulong)uVar9;
                  if ((pbVar37 < pInLimit) && ((byte *)((long)piVar27 + uVar20) == pbVar37)) {
                    uVar9 = LZ4_count(pbVar37,puVar3 + uVar28,pInLimit);
                    uVar20 = uVar20 + uVar9;
                  }
                }
                else {
                  pBVar40 = puVar3 + uVar23;
                  uVar9 = LZ4_count((BYTE *)piVar27,pBVar40,pInLimit);
                  uVar20 = (ulong)uVar9;
                }
                if (uStack_18118 < uVar20) {
                  matches[iVar24].off = (int)piVar27 - (uVar23 + (int)puVar3);
                  matches[iVar24].len = (int)uVar20;
                  iVar24 = iVar24 + 1;
                  uStack_18118 = uVar20;
                  if (0x1000 < uVar20) break;
                }
                if (pInLimit <= (byte *)((long)piVar27 + uVar20)) break;
                uVar16 = (ulong)((uVar23 & 0xffff) * 2);
                if (*(byte *)((long)piVar27 + uVar20) < pBVar40[uVar20]) {
                  *puStack_18150 = (ushort)uVar6;
                  puStack_18150 = ctx->chainTable + uVar16;
                  uVar6 = (uint)*puStack_18150;
                  if (*puStack_18150 == 0xffff) break;
                  uVar5 = uVar5 + uVar6;
                  uVar9 = uVar6;
                }
                else {
                  *puStack_180e0 = (short)uVar5;
                  puStack_180e0 = (undefined2 *)((long)ctx->chainTable + (uVar16 * 2 | 2));
                  uVar2 = ctx->chainTable[uVar16 + 1];
                  uVar5 = (uint)uVar2;
                  if (uVar2 == 0xffff) break;
                  uVar9 = (uint)uVar2;
                  uVar6 = uVar6 + uVar9;
                }
              }
              *puStack_18150 = 0xffff;
              *puStack_180e0 = 0xffff;
              uStack_18140 = (ulong)(uVar7 + 1);
              ctx->nextToUpdate = uVar7 + 1;
              if (iVar24 == 0) goto LAB_001348ce;
              lVar15 = (long)iVar24;
              uVar20 = (ulong)matches[lVar15 + -1].len;
              if (uVar30 < uVar20) {
                pLVar19 = matches + lVar15 + -1;
                uVar22 = uVar34 + 1;
                goto LAB_00134a8b;
              }
            }
            for (lVar31 = 0; lVar31 != lVar15; lVar31 = lVar31 + 1) {
              uVar20 = 4;
              if (lVar31 != 0) {
                uVar20 = (long)matches[lVar31 + -1].len + 1;
              }
              uVar16 = (long)matches[lVar31].len;
              if (0xfff < uVar34 + (long)matches[lVar31].len) {
                uVar16 = 0x1000 - uVar34;
              }
              for (; uVar20 <= uVar16; uVar20 = uVar20 + 1) {
                if (opt[uVar34].mlen == 1) {
                  uVar7 = opt[uVar34].litlen;
                  uVar17 = (ulong)(int)uVar7;
                  lVar13 = uVar34 - uVar17;
                  if (uVar34 < uVar17 || lVar13 == 0) {
                    uVar17 = uVar17 + uVar26;
                    if (0xe < uVar17) {
                      uVar17 = uVar17 + (uVar17 - 0xf) / 0xff + 1;
                    }
                    lVar13 = uVar17 + 3;
                    if (0x12 < uVar20) {
                      lVar13 = lVar13 + (uVar20 - 0x13) / 0xff + 1;
                    }
                    uVar17 = lVar13 - uVar11;
                  }
                  else {
                    if (0xe < uVar7) {
                      uVar17 = uVar17 + (uVar17 - 0xf) / 0xff + 1;
                    }
                    lVar18 = uVar17 + 3;
                    if (0x12 < uVar20) {
                      lVar18 = lVar18 + (uVar20 - 0x13) / 0xff + 1;
                    }
                    uVar17 = lVar18 + opt[lVar13].price;
                  }
                }
                else {
                  lVar13 = 3;
                  if (0x12 < uVar20) {
                    lVar13 = (uVar20 - 0x13) / 0xff + 4;
                  }
                  uVar17 = lVar13 + pLVar21->price;
                  uVar7 = 0;
                }
                uVar1 = uVar20 + uVar34;
                if ((uVar22 < uVar1) || (uVar17 < (ulong)(long)opt[uVar1].price)) {
                  pLVar12 = opt + uVar22 + 1;
                  for (; uVar22 < uVar1; uVar22 = uVar22 + 1) {
                    pLVar12->price = 0x40000000;
                    pLVar12 = pLVar12 + 1;
                  }
                  opt[uVar1].mlen = (int)uVar20;
                  opt[uVar1].off = matches[lVar31].off;
                  opt[uVar1].litlen = uVar7;
                  opt[uVar1].price = (int)uVar17;
                }
              }
            }
          }
          pLVar19 = (LZ4HC_match_t *)&opt[uVar22].off;
          uVar20 = (ulong)opt[uVar22].mlen;
          uVar34 = uVar22 - uVar20;
          goto LAB_00134a8b;
        }
      }
    }
    pIn_00 = (int *)((long)pIn_00 + 1);
  } while( true );
}

Assistant:

static int LZ4HC_compress_optimal (
    LZ4HC_CCtx_internal* ctx,
    const char* const source,
    char* dest,
    int inputSize,
    int maxOutputSize,
    limitedOutput_directive limit,
    size_t sufficient_len,
    const int fullUpdate
    )
{
    LZ4HC_optimal_t opt[LZ4_OPT_NUM + 1];   /* this uses a bit too much stack memory to my taste ... */
    LZ4HC_match_t matches[LZ4_OPT_NUM + 1];

    const BYTE* ip = (const BYTE*) source;
    const BYTE* anchor = ip;
    const BYTE* const iend = ip + inputSize;
    const BYTE* const mflimit = iend - MFLIMIT;
    const BYTE* const matchlimit = (iend - LASTLITERALS);
    BYTE* op = (BYTE*) dest;
    BYTE* const oend = op + maxOutputSize;

    /* init */
    if (sufficient_len >= LZ4_OPT_NUM) sufficient_len = LZ4_OPT_NUM-1;
    ctx->end += inputSize;
    ip++;

    /* Main Loop */
    while (ip < mflimit) {
        size_t const llen = ip - anchor;
        size_t last_pos = 0;
        size_t match_num, cur, best_mlen, best_off;
        memset(opt, 0, sizeof(LZ4HC_optimal_t));

        match_num = LZ4HC_BinTree_GetAllMatches(ctx, ip, matchlimit, MINMATCH-1, matches, fullUpdate);
        if (!match_num) { ip++; continue; }

        if ((size_t)matches[match_num-1].len > sufficient_len) {
            /* good enough solution : immediate encoding */
            best_mlen = matches[match_num-1].len;
            best_off = matches[match_num-1].off;
            cur = 0;
            last_pos = 1;
            goto encode;
        }

        /* set prices using matches at position = 0 */
        {   size_t matchNb;
            for (matchNb = 0; matchNb < match_num; matchNb++) {
                size_t mlen = (matchNb>0) ? (size_t)matches[matchNb-1].len+1 : MINMATCH;
                best_mlen = matches[matchNb].len;   /* necessarily < sufficient_len < LZ4_OPT_NUM */
                for ( ; mlen <= best_mlen ; mlen++) {
                    size_t const cost = LZ4HC_sequencePrice(llen, mlen) - LZ4HC_literalsPrice(llen);
                    SET_PRICE(mlen, mlen, matches[matchNb].off, 0, cost);   /* updates last_pos and opt[pos] */
        }   }   }

        if (last_pos < MINMATCH) { ip++; continue; }  /* note : on clang at least, this test improves performance */

        /* check further positions */
        opt[0].mlen = opt[1].mlen = 1;
        for (cur = 1; cur <= last_pos; cur++) {
            const BYTE* const curPtr = ip + cur;

            /* establish baseline price if cur is literal */
            {   size_t price, litlen;
                if (opt[cur-1].mlen == 1) {
                    /* no match at previous position */
                    litlen = opt[cur-1].litlen + 1;
                    if (cur > litlen) {
                        price = opt[cur - litlen].price + LZ4HC_literalsPrice(litlen);
                    } else {
                        price = LZ4HC_literalsPrice(llen + litlen) - LZ4HC_literalsPrice(llen);
                    }
                } else {
                    litlen = 1;
                    price = opt[cur - 1].price + LZ4HC_literalsPrice(1);
                }

                if (price < (size_t)opt[cur].price)
                    SET_PRICE(cur, 1, 0, litlen, price);   /* note : increases last_pos */
            }

            if (cur == last_pos || curPtr >= mflimit) break;

            match_num = LZ4HC_BinTree_GetAllMatches(ctx, curPtr, matchlimit, MINMATCH-1, matches, fullUpdate);
            if ((match_num > 0) && (size_t)matches[match_num-1].len > sufficient_len) {
                /* immediate encoding */
                best_mlen = matches[match_num-1].len;
                best_off = matches[match_num-1].off;
                last_pos = cur + 1;
                goto encode;
            }

            /* set prices using matches at position = cur */
            {   size_t matchNb;
                for (matchNb = 0; matchNb < match_num; matchNb++) {
                    size_t ml = (matchNb>0) ? (size_t)matches[matchNb-1].len+1 : MINMATCH;
                    best_mlen = (cur + matches[matchNb].len < LZ4_OPT_NUM) ?
                                (size_t)matches[matchNb].len : LZ4_OPT_NUM - cur;

                    for ( ; ml <= best_mlen ; ml++) {
                        size_t ll, price;
                        if (opt[cur].mlen == 1) {
                            ll = opt[cur].litlen;
                            if (cur > ll)
                                price = opt[cur - ll].price + LZ4HC_sequencePrice(ll, ml);
                            else
                                price = LZ4HC_sequencePrice(llen + ll, ml) - LZ4HC_literalsPrice(llen);
                        } else {
                            ll = 0;
                            price = opt[cur].price + LZ4HC_sequencePrice(0, ml);
                        }

                        if (cur + ml > last_pos || price < (size_t)opt[cur + ml].price) {
                            SET_PRICE(cur + ml, ml, matches[matchNb].off, ll, price);
            }   }   }   }
        } /* for (cur = 1; cur <= last_pos; cur++) */

        best_mlen = opt[last_pos].mlen;
        best_off = opt[last_pos].off;
        cur = last_pos - best_mlen;

encode: /* cur, last_pos, best_mlen, best_off must be set */
        opt[0].mlen = 1;
        while (1) {  /* from end to beginning */
            size_t const ml = opt[cur].mlen;
            int const offset = opt[cur].off;
            opt[cur].mlen = (int)best_mlen;
            opt[cur].off = (int)best_off;
            best_mlen = ml;
            best_off = offset;
            if (ml > cur) break;
            cur -= ml;
        }

        /* encode all recorded sequences */
        cur = 0;
        while (cur < last_pos) {
            int const ml = opt[cur].mlen;
            int const offset = opt[cur].off;
            if (ml == 1) { ip++; cur++; continue; }
            cur += ml;
            if ( LZ4HC_encodeSequence(&ip, &op, &anchor, ml, ip - offset, limit, oend) ) return 0;
        }
    }  /* while (ip < mflimit) */

    /* Encode Last Literals */
    {   int lastRun = (int)(iend - anchor);
        if ((limit) && (((char*)op - dest) + lastRun + 1 + ((lastRun+255-RUN_MASK)/255) > (U32)maxOutputSize)) return 0;  /* Check output limit */
        if (lastRun>=(int)RUN_MASK) { *op++=(RUN_MASK<<ML_BITS); lastRun-=RUN_MASK; for(; lastRun > 254 ; lastRun-=255) *op++ = 255; *op++ = (BYTE) lastRun; }
        else *op++ = (BYTE)(lastRun<<ML_BITS);
        memcpy(op, anchor, iend - anchor);
        op += iend-anchor;
    }

    /* End */
    return (int) ((char*)op-dest);
}